

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::StrEqualityMatcher<std::__cxx11::string>::MatchAndExplain<std::__cxx11::string>
          (StrEqualityMatcher<std::__cxx11::string> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
          MatchResultListener *param_2)

{
  StrEqualityMatcher<std::__cxx11::string> SVar1;
  StrEqualityMatcher<std::__cxx11::string> SVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_28;
  
  std::__cxx11::string::string((string *)&bStack_28,(string *)s);
  if (this[0x21] == (StrEqualityMatcher<std::__cxx11::string>)0x1) {
    SVar2 = (StrEqualityMatcher<std::__cxx11::string>)
            std::operator==(&bStack_28,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this);
  }
  else {
    SVar2 = (StrEqualityMatcher<std::__cxx11::string>)
            CaseInsensitiveStringEquals<std::__cxx11::string>
                      (&bStack_28,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  }
  SVar1 = this[0x20];
  std::__cxx11::string::~string((string *)&bStack_28);
  return SVar1 == SVar2;
}

Assistant:

bool MatchAndExplain(const MatcheeStringType& s,
                       MatchResultListener* /* listener */) const {
    const StringType s2(s);
    const bool eq = case_sensitive_ ? s2 == string_ :
        CaseInsensitiveStringEquals(s2, string_);
    return expect_eq_ == eq;
  }